

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.c
# Opt level: O3

int compare_components(component_t *u1,component_t *u2)

{
  byte bVar1;
  byte *__s1;
  byte *pbVar2;
  byte *__s2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  size_t __n;
  byte bVar7;
  byte bVar8;
  
  uVar4 = 0xffffffff;
  if ((u2->metaorder <= u1->metaorder) && (uVar4 = 1, u1->metaorder <= u2->metaorder)) {
    __s1 = (byte *)u1->start;
    pbVar2 = (byte *)u1->end;
    __s2 = (byte *)u2->start;
    pbVar3 = (byte *)u2->end;
    uVar4 = 1;
    if (__s1 == pbVar2) {
      uVar4 = (__s1 == pbVar2 && __s2 == pbVar3) - 1;
    }
    if (__s1 != pbVar2 && __s2 != pbVar3) {
      bVar6 = *__s1;
      bVar7 = (bVar6 & 0xdf) + 0xbf;
      bVar1 = *__s2;
      bVar8 = (bVar1 & 0xdf) + 0xbf;
      if ((bVar7 < 0x1a) && (bVar8 < 0x1a)) {
        bVar7 = bVar6 | 0x20;
        if (0x19 < (byte)(bVar6 + 0xbf)) {
          bVar7 = bVar6;
        }
        bVar6 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar6 = bVar1;
        }
        uVar4 = 0xffffffff;
        if ((char)bVar6 <= (char)bVar7) {
          return (int)((char)bVar6 < (char)bVar7);
        }
      }
      else {
        uVar4 = -(uint)(bVar7 < 0x1a) | 1;
        if ((0x19 < bVar7) && (0x19 < bVar8)) {
          __n = (long)pbVar2 - (long)__s1;
          uVar4 = 0xffffffff;
          if (((long)pbVar3 - (long)__s2 <= (long)__n) &&
             (uVar4 = 1, (long)__n <= (long)pbVar3 - (long)__s2)) {
            iVar5 = memcmp(__s1,__s2,__n);
            uVar4 = 0xffffffff;
            if (-1 < iVar5) {
              uVar4 = (uint)(iVar5 != 0);
            }
            return uVar4;
          }
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int compare_components(const component_t* u1, const component_t* u2) {
	/* metaorder has highest priority */
	if (u1->metaorder < u2->metaorder) {
		return -1;
	}
	if (u1->metaorder > u2->metaorder) {
		return 1;
	}

	/* empty strings come before everything */
	int u1_is_empty = u1->start == u1->end;
	int u2_is_empty = u2->start == u2->end;

	if (u1_is_empty && u2_is_empty) {
		return 0;
	}
	if (u1_is_empty) {
		return -1;
	}
	if (u2_is_empty) {
		return 1;
	}

	/* alpha come before numbers  */
	int u1_is_alpha = my_isalpha(*u1->start);
	int u2_is_alpha = my_isalpha(*u2->start);

	if (u1_is_alpha && u2_is_alpha) {
		if (my_tolower(*u1->start) < my_tolower(*u2->start)) {
			return -1;
		}
		if (my_tolower(*u1->start) > my_tolower(*u2->start)) {
			return 1;
		}
		return 0;
	}
	if (u1_is_alpha) {
		return -1;
	}
	if (u2_is_alpha) {
		return 1;
	}

	/* numeric comparison (note that leading zeroes are already trimmed here) */
	if (u1->end - u1->start < u2->end - u2->start) {
		return -1;
	}
	if (u1->end - u1->start > u2->end - u2->start) {
		return 1;
	}

	int res = memcmp(u1->start, u2->start, u1->end - u1->start);
	if (res < 0) {
		return -1;
	}
	if (res > 0) {
		return 1;
	}
	return 0;
}